

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int prototypeArgument(int parBlkSize)

{
  int *piVar1;
  object *poVar2;
  typeDesc *ptVar3;
  typeDesc *ptVar4;
  int iVar5;
  char *msg;
  
  if (currentSymbol == 0x25f) {
    piVar1 = &intTypeIndex;
  }
  else if (currentSymbol == 0x26d) {
    piVar1 = &boolTypeIndex;
  }
  else {
    if (currentSymbol == 0x268) {
      getSymbol();
      if (currentSymbol == 0x1f5) {
        getSymbol();
        poVar2 = find();
        ptVar3 = getType(poVar2->typeIndex);
        if (currentSymbol == 99) {
          getSymbol();
          if (currentSymbol == 0x1f5) {
            poVar2 = newObj(0x2c5);
            getSymbol();
          }
          else {
            poVar2 = newAnonymousObj(0x2c5);
          }
          poVar2->typeIndex = ptVar3->refIndex;
          return parBlkSize + 4;
        }
        msg = "bad struct variable";
      }
      else {
        msg = "missing struct qualifier";
      }
      goto LAB_00105bff;
    }
    if (currentSymbol != 0x261) {
      msg = "bad argument";
      goto LAB_00105bff;
    }
    piVar1 = &charTypeIndex;
  }
  iVar5 = *piVar1;
  getSymbol();
  if (currentSymbol == 0x1f5) {
    poVar2 = newObj(0x2c1);
    getSymbol();
  }
  else {
    poVar2 = newAnonymousObj(0x2c1);
  }
  poVar2->typeIndex = iVar5;
  ptVar3 = getType(iVar5);
  if (currentSymbol == 0x130) {
    getSymbol();
    if (currentSymbol != 0x12f) {
      msg = "missing right bracket";
LAB_00105bff:
      mark(msg);
      exit(-1);
    }
    ptVar3 = newType();
    ptVar3->form = 0x322;
    ptVar4 = getType(iVar5);
    ptVar3->base = ptVar4;
    ptVar3->size = 0xc;
    poVar2->typeIndex = ptVar3->index;
    poVar2->cl = 0x2c5;
    iVar5 = parBlkSize + 0xc;
    getSymbol();
  }
  else {
    iVar5 = parBlkSize + ptVar3->size;
  }
  return iVar5;
}

Assistant:

procedure 
int prototypeArgument(int parBlkSize)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;

	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) { /* int, char, bool */
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_VAR);
			getSymbol();
		} else {
			obj = newAnonymousObj(CLASS_VAR); 
		}
		obj->typeIndex = tpIndex;
		type = getType(tpIndex);
		parSize = parBlkSize + type->size;
		if (currentSymbol == SYMBOL_LBRAK) { /* char [] */
			getSymbol();
			if (currentSymbol == SYMBOL_RBRAK) { 
				tp = newType();
				tp->form = FORM_ARRAY;
				type = getType(tpIndex);
				tp->base = type;
				tp->size = wordSize + 8; 
				obj->typeIndex = tp->index;
				obj->cl = CLASS_PAR; 
				parSize = parBlkSize + wordSize + 8; 
				getSymbol();
			} else {
				mark("missing right bracket");
				exit(-1);
			}
		}	
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					obj = newObj(CLASS_PAR);
					getSymbol();
				} else {
					obj = newAnonymousObj(CLASS_PAR);
				}
				obj->typeIndex = type->refIndex;
				parSize = parBlkSize + wordSize;
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing struct qualifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}